

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_interp.c
# Opt level: O3

REF_STATUS ref_interp_pack(REF_INTERP ref_interp,REF_INT *n2o)

{
  undefined8 *puVar1;
  REF_DBL *pRVar2;
  size_t __size;
  undefined8 *puVar3;
  REF_DBL *pRVar4;
  uint uVar5;
  uint max;
  REF_INT *pRVar6;
  REF_DBL *pRVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  REF_DBL RVar10;
  REF_DBL RVar11;
  REF_DBL RVar12;
  uint uVar13;
  long lVar14;
  void *pvVar15;
  ulong uVar16;
  undefined8 uVar17;
  ulong uVar18;
  REF_STATUS RVar19;
  long lVar20;
  char *pcVar21;
  ulong uVar22;
  
  RVar19 = 0;
  if (ref_interp != (REF_INTERP)0x0) {
    uVar5 = ref_interp->to_grid->node->n;
    uVar18 = (ulong)uVar5;
    max = ref_interp->max;
    uVar22 = (ulong)max;
    if (((int)max < (int)uVar5) && (uVar13 = ref_interp_resize(ref_interp,max), uVar13 != 0)) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
             0x13a,"ref_interp_pack",(ulong)uVar13,"match node max");
      return uVar13;
    }
    lVar14 = (long)ref_interp->ref_agents->n;
    if (lVar14 == 0) {
      if (0 < (int)max) {
        uVar16 = 0;
        do {
          lVar14 = (long)ref_interp->agent_hired[uVar16];
          if (lVar14 != 0) {
            pcVar21 = "can\'t pack hired agents";
            uVar17 = 0x13f;
            goto LAB_00172232;
          }
          uVar16 = uVar16 + 1;
        } while (uVar22 != uVar16);
      }
      if (-1 < (int)max) {
        __size = uVar22 * 4;
        pvVar15 = malloc(__size);
        if (pvVar15 == (void *)0x0) {
          pcVar21 = "malloc int_copy of REF_INT NULL";
          uVar17 = 0x142;
        }
        else {
          if (uVar22 != 0) {
            memcpy(pvVar15,ref_interp->cell,__size);
          }
          if (0 < (int)uVar5) {
            pRVar6 = ref_interp->cell;
            uVar16 = 0;
            do {
              pRVar6[uVar16] = *(REF_INT *)((long)pvVar15 + (long)n2o[uVar16] * 4);
              uVar16 = uVar16 + 1;
            } while (uVar18 != uVar16);
          }
          if ((int)uVar5 < (int)max) {
            memset(ref_interp->cell + (int)uVar5,0xff,(ulong)(~uVar5 + max) * 4 + 4);
          }
          if (uVar22 != 0) {
            memcpy(pvVar15,ref_interp->part,__size);
          }
          if (0 < (int)uVar5) {
            pRVar6 = ref_interp->part;
            uVar16 = 0;
            do {
              pRVar6[uVar16] = *(REF_INT *)((long)pvVar15 + (long)n2o[uVar16] * 4);
              uVar16 = uVar16 + 1;
            } while (uVar18 != uVar16);
          }
          if ((int)uVar5 < (int)max) {
            memset(ref_interp->part + (int)uVar5,0xff,(ulong)(~uVar5 + max) * 4 + 4);
          }
          free(pvVar15);
          pvVar15 = malloc((ulong)(max * 4) << 3);
          if (pvVar15 != (void *)0x0) {
            if (uVar22 != 0) {
              pRVar7 = ref_interp->bary;
              lVar14 = 0;
              do {
                puVar1 = (undefined8 *)((long)pRVar7 + lVar14);
                uVar17 = *puVar1;
                uVar8 = puVar1[1];
                puVar1 = (undefined8 *)((long)pRVar7 + lVar14 + 0x10);
                uVar9 = puVar1[1];
                puVar3 = (undefined8 *)((long)pvVar15 + lVar14 + 0x10);
                *puVar3 = *puVar1;
                puVar3[1] = uVar9;
                *(undefined8 *)((long)pvVar15 + lVar14) = uVar17;
                ((undefined8 *)((long)pvVar15 + lVar14))[1] = uVar8;
                lVar14 = lVar14 + 0x20;
              } while (uVar22 << 5 != lVar14);
            }
            if (0 < (int)uVar5) {
              pRVar7 = ref_interp->bary;
              lVar14 = 0;
              do {
                lVar20 = (long)*(int *)((long)n2o + lVar14) * 0x20;
                pRVar2 = (REF_DBL *)((long)pvVar15 + lVar20);
                RVar10 = *pRVar2;
                RVar11 = pRVar2[1];
                pRVar2 = (REF_DBL *)((long)pvVar15 + lVar20 + 0x10);
                RVar12 = pRVar2[1];
                pRVar4 = pRVar7 + lVar14 + 2;
                *pRVar4 = *pRVar2;
                pRVar4[1] = RVar12;
                pRVar2 = pRVar7 + lVar14;
                *pRVar2 = RVar10;
                pRVar2[1] = RVar11;
                lVar14 = lVar14 + 4;
              } while (uVar18 << 2 != lVar14);
            }
            free(pvVar15);
            return 0;
          }
          pcVar21 = "malloc dbl_copy of REF_DBL NULL";
          uVar17 = 0x157;
        }
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
               uVar17,"ref_interp_pack",pcVar21);
        return 2;
      }
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
             0x142,"ref_interp_pack","malloc int_copy of REF_INT negative");
    }
    else {
      pcVar21 = "can\'t pack active agents";
      uVar17 = 0x13c;
LAB_00172232:
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
             uVar17,"ref_interp_pack",pcVar21,0,lVar14);
    }
    RVar19 = 1;
  }
  return RVar19;
}

Assistant:

REF_FCN REF_STATUS ref_interp_pack(REF_INTERP ref_interp, REF_INT *n2o) {
  REF_INT *int_copy;
  REF_DBL *dbl_copy;
  REF_INT i, node, n, max;

  if (NULL == ref_interp) return REF_SUCCESS;

  n = ref_node_n(ref_grid_node(ref_interp_to_grid(ref_interp)));
  max = ref_interp_max(ref_interp);
  if (n > max) {
    RSS(ref_interp_resize(ref_interp, max), "match node max");
  }
  REIS(0, ref_agents_n(ref_interp->ref_agents), "can't pack active agents");

  for (node = 0; node < max; node++) {
    REIS(REF_FALSE, ref_interp->agent_hired[node], "can't pack hired agents");
  }

  ref_malloc(int_copy, max, REF_INT);
  for (node = 0; node < max; node++) {
    int_copy[node] = ref_interp->cell[node];
  }
  for (node = 0; node < n; node++) {
    ref_interp->cell[node] = int_copy[n2o[node]];
  }
  for (node = n; node < max; node++) {
    ref_interp->cell[node] = REF_EMPTY;
  }
  for (node = 0; node < max; node++) {
    int_copy[node] = ref_interp->part[node];
  }
  for (node = 0; node < n; node++) {
    ref_interp->part[node] = int_copy[n2o[node]];
  }
  for (node = n; node < max; node++) {
    ref_interp->part[node] = REF_EMPTY;
  }
  ref_free(int_copy);

  ref_malloc(dbl_copy, 4 * max, REF_DBL);
  for (node = 0; node < max; node++) {
    for (i = 0; i < 4; i++) {
      dbl_copy[i + 4 * node] = ref_interp->bary[i + 4 * node];
    }
  }
  for (node = 0; node < n; node++) {
    for (i = 0; i < 4; i++) {
      ref_interp->bary[i + 4 * node] = dbl_copy[i + 4 * n2o[node]];
    }
  }
  ref_free(dbl_copy);

  return REF_SUCCESS;
}